

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.hpp
# Opt level: O2

void __thiscall inja::Template::Template(Template *this,string *content)

{
  _Rb_tree_header *p_Var1;
  
  (this->root).super_AstNode.pos = 0;
  (this->root).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_00150068;
  (this->root).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&this->content,(string *)content);
  p_Var1 = &(this->block_storage)._M_t._M_impl.super__Rb_tree_header;
  (this->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->block_storage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit Template(std::string content): content(std::move(content)) {}